

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * sqlite3_value_dup(sqlite3_value *pOrig)

{
  u8 uVar1;
  u8 uVar2;
  int iVar3;
  Mem *local_20;
  sqlite3_value *pNew;
  sqlite3_value *pOrig_local;
  
  if (pOrig == (sqlite3_value *)0x0) {
    pOrig_local = (sqlite3_value *)0x0;
  }
  else {
    local_20 = (Mem *)sqlite3_malloc(0x38);
    if (local_20 == (Mem *)0x0) {
      pOrig_local = (sqlite3_value *)0x0;
    }
    else {
      memset(local_20,0,0x38);
      local_20->u = pOrig->u;
      uVar1 = pOrig->enc;
      uVar2 = pOrig->eSubtype;
      iVar3 = pOrig->n;
      local_20->flags = pOrig->flags;
      local_20->enc = uVar1;
      local_20->eSubtype = uVar2;
      local_20->n = iVar3;
      local_20->z = pOrig->z;
      local_20->flags = local_20->flags & 0xfbff;
      local_20->db = (sqlite3 *)0x0;
      if ((local_20->flags & 0x12) != 0) {
        local_20->flags = local_20->flags & 0xf3ff;
        local_20->flags = local_20->flags | 0x1000;
        iVar3 = sqlite3VdbeMemMakeWriteable(local_20);
        if (iVar3 != 0) {
          sqlite3ValueFree(local_20);
          local_20 = (Mem *)0x0;
        }
      }
      pOrig_local = local_20;
    }
  }
  return pOrig_local;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_value_dup(const sqlite3_value *pOrig){
  sqlite3_value *pNew;
  if( pOrig==0 ) return 0;
  pNew = sqlite3_malloc( sizeof(*pNew) );
  if( pNew==0 ) return 0;
  memset(pNew, 0, sizeof(*pNew));
  memcpy(pNew, pOrig, MEMCELLSIZE);
  pNew->flags &= ~MEM_Dyn;
  pNew->db = 0;
  if( pNew->flags&(MEM_Str|MEM_Blob) ){
    pNew->flags &= ~(MEM_Static|MEM_Dyn);
    pNew->flags |= MEM_Ephem;
    if( sqlite3VdbeMemMakeWriteable(pNew)!=SQLITE_OK ){
      sqlite3ValueFree(pNew);
      pNew = 0;
    }
  }
  return pNew;
}